

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-devurandom.c
# Opt level: O2

int uv__random_readpath(char *path,void *buf,size_t buflen)

{
  int __fd;
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  stat s;
  
  __fd = uv__open_cloexec(path,0);
  if (-1 < __fd) {
    iVar1 = fstat64(__fd,(stat64 *)&s);
    if (iVar1 == 0) {
      if ((s.st_mode & 0xf000) == 0x2000) {
        for (lVar4 = 0; buflen - lVar4 != 0; lVar4 = lVar4 + sVar3) {
          while (sVar3 = read(__fd,(void *)((long)buf + lVar4),buflen - lVar4), sVar3 == -1) {
            piVar2 = __errno_location();
            if (*piVar2 != 4) {
              uv__close(__fd);
              return -*piVar2;
            }
          }
          if (sVar3 == 0) goto LAB_00114f30;
        }
        uv__close(__fd);
        __fd = 0;
      }
      else {
LAB_00114f30:
        uv__close(__fd);
        __fd = -5;
      }
    }
    else {
      uv__close(__fd);
      piVar2 = __errno_location();
      __fd = -*piVar2;
    }
  }
  return __fd;
}

Assistant:

int uv__random_readpath(const char* path, void* buf, size_t buflen) {
  struct stat s;
  size_t pos;
  ssize_t n;
  int fd;

  fd = uv__open_cloexec(path, O_RDONLY);

  if (fd < 0)
    return fd;

  if (uv__fstat(fd, &s)) {
    uv__close(fd);
    return UV__ERR(errno);
  }

  if (!S_ISCHR(s.st_mode)) {
    uv__close(fd);
    return UV_EIO;
  }

  for (pos = 0; pos != buflen; pos += n) {
    do
      n = read(fd, (char*) buf + pos, buflen - pos);
    while (n == -1 && errno == EINTR);

    if (n == -1) {
      uv__close(fd);
      return UV__ERR(errno);
    }

    if (n == 0) {
      uv__close(fd);
      return UV_EIO;
    }
  }

  uv__close(fd);
  return 0;
}